

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::imageFormatProperties2
          (TestStatus *__return_storage_ptr__,Context *context,VkFormat format,VkImageType imageType
          ,VkImageTiling tiling)

{
  ostringstream *this;
  ostringstream *this_00;
  ostringstream *this_01;
  PlatformInterface *vkp;
  TestLog *pTVar1;
  VkPhysicalDevice physicalDevice;
  VkResult VVar2;
  VkResult VVar3;
  TestError *this_02;
  undefined4 in_register_00000014;
  ulong uVar4;
  VkImageUsageFlags usage;
  VkImageCreateFlags flags;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  VkImageFormatProperties2KHR extProperties;
  VkPhysicalDeviceImageFormatInfo2KHR imageFormatInfo;
  VkImageFormatProperties coreProperties;
  Enum<vk::VkResult,_4UL> local_648;
  undefined1 local_638 [16];
  TestLog local_628 [13];
  ios_base local_5c0 [264];
  InstanceDriver vki;
  undefined1 local_330 [384];
  undefined1 local_1b0 [384];
  
  vkp = context->m_platformInterface;
  pTVar1 = context->m_testCtx->m_log;
  createInstanceWithExtension
            ((Move<vk::VkInstance_s_*> *)&vki,vkp,(char *)CONCAT44(in_register_00000014,format));
  ::vk::InstanceDriver::InstanceDriver
            (&vki,vkp,(VkInstance)vki.super_InstanceInterface._vptr_InstanceInterface);
  ::vk::enumeratePhysicalDevices
            (&devices,&vki.super_InstanceInterface,
             (VkInstance)vki.super_InstanceInterface._vptr_InstanceInterface);
  if (devices.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      devices.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      physicalDevice =
           devices.
           super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar4];
      usage = 1;
      do {
        flags = 0;
        do {
          imageFormatInfo.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_FORMAT_INFO_2_KHR;
          imageFormatInfo.pNext = (void *)0x0;
          coreProperties.maxExtent.width = 0xcdcdcdcd;
          coreProperties.maxExtent.height = 0xcdcdcdcd;
          coreProperties.maxExtent.depth = 0xcdcdcdcd;
          coreProperties.maxMipLevels = 0xcdcdcdcd;
          coreProperties.maxArrayLayers = 0xcdcdcdcd;
          coreProperties.sampleCounts = 0xcdcdcdcd;
          coreProperties.maxResourceSize = 0xcdcdcdcdcdcdcdcd;
          extProperties.imageFormatProperties.maxExtent.width = 0xcdcdcdcd;
          extProperties.imageFormatProperties.maxExtent.height = 0xcdcdcdcd;
          extProperties.imageFormatProperties.maxExtent.depth = 0xcdcdcdcd;
          extProperties.imageFormatProperties.maxMipLevels = 0xcdcdcdcd;
          extProperties.imageFormatProperties.maxArrayLayers = 0xcdcdcdcd;
          extProperties.imageFormatProperties.sampleCounts = 0xcdcdcdcd;
          extProperties.imageFormatProperties.maxResourceSize = 0xcdcdcdcdcdcdcdcd;
          extProperties.sType = VK_STRUCTURE_TYPE_IMAGE_FORMAT_PROPERTIES_2_KHR;
          extProperties._4_4_ = 0xcdcdcdcd;
          extProperties.pNext = (void *)0x0;
          imageFormatInfo.format = format;
          imageFormatInfo.type = imageType;
          imageFormatInfo.tiling = tiling;
          imageFormatInfo.usage = usage;
          imageFormatInfo.flags = flags;
          VVar2 = ::vk::InstanceDriver::getPhysicalDeviceImageFormatProperties
                            (&vki,physicalDevice,format,imageType,tiling,usage,flags,&coreProperties
                            );
          VVar3 = ::vk::InstanceDriver::getPhysicalDeviceImageFormatProperties2KHR
                            (&vki,physicalDevice,&imageFormatInfo,&extProperties);
          if (extProperties.sType != VK_STRUCTURE_TYPE_IMAGE_FORMAT_PROPERTIES_2_KHR) {
            this_02 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_02,(char *)0x0,
                       "extProperties.sType == VK_STRUCTURE_TYPE_IMAGE_FORMAT_PROPERTIES_2_KHR",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                       ,0x994);
LAB_00423f2d:
            __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          if (extProperties.pNext != (void *)0x0) {
            this_02 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_02,(char *)0x0,"extProperties.pNext == DE_NULL",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                       ,0x995);
            goto LAB_00423f2d;
          }
          if ((VVar2 != VVar3) ||
             (auVar6[0] = -((char)coreProperties.maxArrayLayers ==
                           (char)extProperties.imageFormatProperties.maxArrayLayers),
             auVar6[1] = -(coreProperties.maxArrayLayers._1_1_ ==
                          extProperties.imageFormatProperties.maxArrayLayers._1_1_),
             auVar6[2] = -(coreProperties.maxArrayLayers._2_1_ ==
                          extProperties.imageFormatProperties.maxArrayLayers._2_1_),
             auVar6[3] = -(coreProperties.maxArrayLayers._3_1_ ==
                          extProperties.imageFormatProperties.maxArrayLayers._3_1_),
             auVar6[4] = -((char)coreProperties.sampleCounts ==
                          (char)extProperties.imageFormatProperties.sampleCounts),
             auVar6[5] = -(coreProperties.sampleCounts._1_1_ ==
                          extProperties.imageFormatProperties.sampleCounts._1_1_),
             auVar6[6] = -(coreProperties.sampleCounts._2_1_ ==
                          extProperties.imageFormatProperties.sampleCounts._2_1_),
             auVar6[7] = -(coreProperties.sampleCounts._3_1_ ==
                          extProperties.imageFormatProperties.sampleCounts._3_1_),
             auVar6[8] = -((char)coreProperties.maxResourceSize ==
                          (char)extProperties.imageFormatProperties.maxResourceSize),
             auVar6[9] = -(coreProperties.maxResourceSize._1_1_ ==
                          extProperties.imageFormatProperties.maxResourceSize._1_1_),
             auVar6[10] = -(coreProperties.maxResourceSize._2_1_ ==
                           extProperties.imageFormatProperties.maxResourceSize._2_1_),
             auVar6[0xb] = -(coreProperties.maxResourceSize._3_1_ ==
                            extProperties.imageFormatProperties.maxResourceSize._3_1_),
             auVar6[0xc] = -(coreProperties.maxResourceSize._4_1_ ==
                            extProperties.imageFormatProperties.maxResourceSize._4_1_),
             auVar6[0xd] = -(coreProperties.maxResourceSize._5_1_ ==
                            extProperties.imageFormatProperties.maxResourceSize._5_1_),
             auVar6[0xe] = -(coreProperties.maxResourceSize._6_1_ ==
                            extProperties.imageFormatProperties.maxResourceSize._6_1_),
             auVar6[0xf] = -(coreProperties.maxResourceSize._7_1_ ==
                            extProperties.imageFormatProperties.maxResourceSize._7_1_),
             auVar5[0] = -((char)coreProperties.maxExtent.width ==
                          (char)extProperties.imageFormatProperties.maxExtent.width),
             auVar5[1] = -(coreProperties.maxExtent.width._1_1_ ==
                          extProperties.imageFormatProperties.maxExtent.width._1_1_),
             auVar5[2] = -(coreProperties.maxExtent.width._2_1_ ==
                          extProperties.imageFormatProperties.maxExtent.width._2_1_),
             auVar5[3] = -(coreProperties.maxExtent.width._3_1_ ==
                          extProperties.imageFormatProperties.maxExtent.width._3_1_),
             auVar5[4] = -((char)coreProperties.maxExtent.height ==
                          (char)extProperties.imageFormatProperties.maxExtent.height),
             auVar5[5] = -(coreProperties.maxExtent.height._1_1_ ==
                          extProperties.imageFormatProperties.maxExtent.height._1_1_),
             auVar5[6] = -(coreProperties.maxExtent.height._2_1_ ==
                          extProperties.imageFormatProperties.maxExtent.height._2_1_),
             auVar5[7] = -(coreProperties.maxExtent.height._3_1_ ==
                          extProperties.imageFormatProperties.maxExtent.height._3_1_),
             auVar5[8] = -((char)coreProperties.maxExtent.depth ==
                          (char)extProperties.imageFormatProperties.maxExtent.depth),
             auVar5[9] = -(coreProperties.maxExtent.depth._1_1_ ==
                          extProperties.imageFormatProperties.maxExtent.depth._1_1_),
             auVar5[10] = -(coreProperties.maxExtent.depth._2_1_ ==
                           extProperties.imageFormatProperties.maxExtent.depth._2_1_),
             auVar5[0xb] = -(coreProperties.maxExtent.depth._3_1_ ==
                            extProperties.imageFormatProperties.maxExtent.depth._3_1_),
             auVar5[0xc] = -((char)coreProperties.maxMipLevels ==
                            (char)extProperties.imageFormatProperties.maxMipLevels),
             auVar5[0xd] = -(coreProperties.maxMipLevels._1_1_ ==
                            extProperties.imageFormatProperties.maxMipLevels._1_1_),
             auVar5[0xe] = -(coreProperties.maxMipLevels._2_1_ ==
                            extProperties.imageFormatProperties.maxMipLevels._2_1_),
             auVar5[0xf] = -(coreProperties.maxMipLevels._3_1_ ==
                            extProperties.imageFormatProperties.maxMipLevels._3_1_),
             auVar5 = auVar5 & auVar6,
             (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) != 0xffff)) {
            this = (ostringstream *)(local_330 + 8);
            local_330._0_8_ = pTVar1;
            std::__cxx11::ostringstream::ostringstream(this);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"ERROR: device ",0xe)
            ;
            std::ostream::_M_insert<unsigned_long>((ulong)this);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this,": mismatch with query ",0x16);
            ::vk::operator<<((ostream *)this,&imageFormatInfo);
            local_1b0._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            this_00 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"vkGetPhysicalDeviceImageFormatProperties() returned ",
                       0x34);
            local_648.m_getName = ::vk::getResultName;
            local_648.m_value = VVar2;
            tcu::Format::Enum<vk::VkResult,_4UL>::toStream(&local_648,(ostream *)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            ::vk::operator<<((ostream *)this_00,&coreProperties);
            local_638._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            this_01 = (ostringstream *)(local_638 + 8);
            std::__cxx11::ostringstream::ostringstream(this_01);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_01,"vkGetPhysicalDeviceImageFormatProperties2KHR() returned "
                       ,0x38);
            local_648.m_getName = ::vk::getResultName;
            local_648.m_value = VVar3;
            tcu::Format::Enum<vk::VkResult,_4UL>::toStream(&local_648,(ostream *)this_01);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
            ::vk::operator<<((ostream *)this_01,&extProperties);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_638,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_01);
            std::ios_base::~ios_base(local_5c0);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
            std::__cxx11::ostringstream::~ostringstream(this);
            std::ios_base::~ios_base((ios_base *)(local_330 + 0x78));
            this_02 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_02,
                       "Mismatch between image format properties reported by vkGetPhysicalDeviceImageFormatProperties and vkGetPhysicalDeviceImageFormatProperties2KHR"
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                       ,0x99d);
            goto LAB_00423f2d;
          }
          flags = flags + 1;
        } while (flags != 0x20);
        usage = usage + 1;
      } while (usage != 0x100);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)devices.
                                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)devices.
                                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_638._0_8_ = local_628;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_638,"Querying image format properties succeeded","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_638._0_8_,
             (long)(qpTestLog **)local_638._0_8_ + local_638._8_8_);
  if ((TestLog *)local_638._0_8_ != local_628) {
    operator_delete((void *)local_638._0_8_,(ulong)((long)&(local_628[0].m_log)->flags + 1));
  }
  if (devices.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(devices.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)devices.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)devices.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::InstanceDriver::~InstanceDriver(&vki);
  if (vki.super_InstanceInterface._vptr_InstanceInterface != (_func_int **)0x0) {
    (*vki.m_vk.destroyInstance)
              ((VkInstance)vki.super_InstanceInterface._vptr_InstanceInterface,
               (VkAllocationCallbacks *)vki.m_vk.enumeratePhysicalDevices);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus imageFormatProperties2 (Context& context, const VkFormat format, const VkImageType imageType, const VkImageTiling tiling)
{
	TestLog&						log				= context.getTestContext().getLog();

	const PlatformInterface&		vkp				= context.getPlatformInterface();
	const Unique<VkInstance>		instance		(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki				(vkp, *instance);
	const vector<VkPhysicalDevice>	devices			= enumeratePhysicalDevices(vki, *instance);

	const VkImageUsageFlags			allUsageFlags	= VK_IMAGE_USAGE_TRANSFER_SRC_BIT
													| VK_IMAGE_USAGE_TRANSFER_DST_BIT
													| VK_IMAGE_USAGE_SAMPLED_BIT
													| VK_IMAGE_USAGE_STORAGE_BIT
													| VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT
													| VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT
													| VK_IMAGE_USAGE_TRANSIENT_ATTACHMENT_BIT
													| VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT;
	const VkImageCreateFlags		allCreateFlags	= VK_IMAGE_CREATE_SPARSE_BINDING_BIT
													| VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT
													| VK_IMAGE_CREATE_SPARSE_ALIASED_BIT
													| VK_IMAGE_CREATE_MUTABLE_FORMAT_BIT
													| VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		const VkPhysicalDevice	physicalDevice	= devices[deviceNdx];

		for (VkImageUsageFlags curUsageFlags = (VkImageUsageFlags)1; curUsageFlags <= allUsageFlags; curUsageFlags++)
		{
			for (VkImageCreateFlags curCreateFlags = 0; curCreateFlags <= allCreateFlags; curCreateFlags++)
			{
				const VkPhysicalDeviceImageFormatInfo2KHR	imageFormatInfo	=
				{
					VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_FORMAT_INFO_2_KHR,
					DE_NULL,
					format,
					imageType,
					tiling,
					curUsageFlags,
					curCreateFlags
				};

				VkImageFormatProperties						coreProperties;
				VkImageFormatProperties2KHR					extProperties;
				VkResult									coreResult;
				VkResult									extResult;

				deMemset(&coreProperties, 0xcd, sizeof(VkImageFormatProperties));
				deMemset(&extProperties, 0xcd, sizeof(VkImageFormatProperties2KHR));

				extProperties.sType = VK_STRUCTURE_TYPE_IMAGE_FORMAT_PROPERTIES_2_KHR;
				extProperties.pNext = DE_NULL;

				coreResult	= vki.getPhysicalDeviceImageFormatProperties(physicalDevice, imageFormatInfo.format, imageFormatInfo.type, imageFormatInfo.tiling, imageFormatInfo.usage, imageFormatInfo.flags, &coreProperties);
				extResult	= vki.getPhysicalDeviceImageFormatProperties2KHR(physicalDevice, &imageFormatInfo, &extProperties);

				TCU_CHECK(extProperties.sType == VK_STRUCTURE_TYPE_IMAGE_FORMAT_PROPERTIES_2_KHR);
				TCU_CHECK(extProperties.pNext == DE_NULL);

				if ((coreResult != extResult) ||
					(deMemCmp(&coreProperties, &extProperties.imageFormatProperties, sizeof(VkImageFormatProperties)) != 0))
				{
					log << TestLog::Message << "ERROR: device " << deviceNdx << ": mismatch with query " << imageFormatInfo << TestLog::EndMessage
						<< TestLog::Message << "vkGetPhysicalDeviceImageFormatProperties() returned " << coreResult << ", " << coreProperties << TestLog::EndMessage
						<< TestLog::Message << "vkGetPhysicalDeviceImageFormatProperties2KHR() returned " << extResult << ", " << extProperties << TestLog::EndMessage;
					TCU_FAIL("Mismatch between image format properties reported by vkGetPhysicalDeviceImageFormatProperties and vkGetPhysicalDeviceImageFormatProperties2KHR");
				}
			}
		}
	}

	return tcu::TestStatus::pass("Querying image format properties succeeded");
}